

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::ArchiveIN(ChBody *this,ChArchiveIn *marchive)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  long lVar4;
  ChArchiveIn *this_00;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  long lVar8;
  bool mflag;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  tempforces;
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  tempmarkers;
  byte local_b1;
  char *local_b0;
  shared_ptr<chrono::collision::ChCollisionModel> *local_a8;
  undefined1 local_a0;
  shared_ptr<chrono::ChForce> local_98;
  shared_ptr<chrono::ChMarker> local_88;
  undefined **local_78;
  ChVariablesBodyOwnMass *local_70;
  long local_68;
  long lStack_60;
  undefined8 local_58;
  ChArchiveIn *local_50;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  local_48;
  
  ChArchiveIn::VersionRead<chrono::ChBody>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  ChBodyFrame::ArchiveIN(&this->super_ChBodyFrame,marchive);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->bflags;
  local_b0 = "bflags";
  local_a0 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_b0);
  local_b0 = "is_fixed";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 7 | this->bflags & 0xffffff7fU;
  local_b0 = "collide";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = this->bflags & 0xfffffffeU | (uint)local_b1;
  local_b0 = "limit_speed";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 8 | this->bflags & 0xfffffeffU;
  local_b0 = "no_gyro_torque";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 0xb | this->bflags & 0xfffff7ffU;
  local_b0 = "use_sleeping";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 10 | this->bflags & 0xfffffbffU;
  local_b0 = "is_sleeping";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 9 | this->bflags & 0xfffffdffU;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_48;
  local_48.
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = 0;
  local_68 = 0;
  lStack_60 = 0;
  local_b0 = "markers";
  local_a0 = 0;
  ChArchiveIn::in<std::shared_ptr<chrono::ChMarker>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
                       *)&local_b0);
  local_b0 = "forces";
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_68;
  local_a0 = 0;
  ChArchiveIn::in<std::shared_ptr<chrono::ChForce>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
                       *)&local_b0);
  psVar1 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->marklist).
                super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    ((psVar5->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body =
         (ChBody *)0x0;
  }
  local_50 = marchive;
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(&this->marklist);
  psVar6 = local_48.
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar7 = local_48.
             super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (psVar7->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var2 = (psVar7->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
      }
      local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      AddMarker(this,&local_88);
      if (local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar6);
  }
  psVar7 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->forcelist).
                super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar7; psVar6 = psVar6 + 1) {
    ((psVar6->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body =
         (ChBody *)0x0;
  }
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::clear(&this->forcelist);
  lVar4 = lStack_60;
  if (local_68 != lStack_60) {
    lVar8 = local_68;
    do {
      local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)lVar8;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 8);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
      }
      local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      AddForce(this,&local_98);
      if (local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != lVar4);
  }
  this_00 = local_50;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->body_id;
  local_b0 = "body_id";
  local_a0 = 0;
  (**(code **)(*(long *)local_50 + 0x38))(local_50);
  local_a8 = &this->collision_model;
  local_b0 = "collision_model";
  local_a0 = 0;
  ChArchiveIn::in<chrono::collision::ChCollisionModel>
            (this_00,(ChNameValue<std::shared_ptr<chrono::collision::ChCollisionModel>_> *)&local_b0
            );
  peVar3 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar3->_vptr_ChCollisionModel[0x16])(peVar3,&this->super_ChContactable_1vars<6>);
  local_70 = (ChVariablesBodyOwnMass *)&this->gyro;
  local_78 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_b0 = "gyro";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_70 = (ChVariablesBodyOwnMass *)&this->Xforce;
  local_78 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_b0 = "Xforce";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_70 = (ChVariablesBodyOwnMass *)&this->Xtorque;
  local_78 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_b0 = "Xtorque";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->density;
  local_b0 = "density";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_70 = &this->variables;
  local_78 = &PTR__ChFunctorArchiveIn_00b2cf30;
  local_b0 = "variables";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->max_speed;
  local_b0 = "max_speed";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->max_wvel;
  local_b0 = "max_wvel";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_time;
  local_b0 = "sleep_time";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_minspeed;
  local_b0 = "sleep_minspeed";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_minwvel;
  local_b0 = "sleep_minwvel";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_starttime;
  local_b0 = "sleep_starttime";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::~vector((vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
             *)&local_68);
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  ~vector((vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           *)&local_48);
  return;
}

Assistant:

void ChBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBody>();

    // deserialize parent class
    ChPhysicsItem::ArchiveIN(marchive);
    // deserialize parent class
    ChBodyFrame::ArchiveIN(marchive);

    // stream in all member data:

    marchive >> CHNVP(bflags);
    bool mflag;  // more readable flag output in case of ASCII in/out
    marchive >> CHNVP(mflag, "is_fixed");
    BFlagSet(BodyFlag::FIXED, mflag);
    marchive >> CHNVP(mflag, "collide");
    BFlagSet(BodyFlag::COLLIDE, mflag);
    marchive >> CHNVP(mflag, "limit_speed");
    BFlagSet(BodyFlag::LIMITSPEED, mflag);
    marchive >> CHNVP(mflag, "no_gyro_torque");
    BFlagSet(BodyFlag::NOGYROTORQUE, mflag);
    marchive >> CHNVP(mflag, "use_sleeping");
    BFlagSet(BodyFlag::USESLEEPING, mflag);
    marchive >> CHNVP(mflag, "is_sleeping");
    BFlagSet(BodyFlag::SLEEPING, mflag);

    std::vector<std::shared_ptr<ChMarker>> tempmarkers;
    std::vector<std::shared_ptr<ChForce>> tempforces;
    marchive >> CHNVP(tempmarkers, "markers");
    marchive >> CHNVP(tempforces, "forces");
    // trick needed because the "Add...() functions are required
    this->RemoveAllMarkers();
    for (auto i : tempmarkers) {
        this->AddMarker(i);
    }
    this->RemoveAllForces();
    for (auto i : tempforces) {
        this->AddForce(i);
    }

    marchive >> CHNVP(body_id);
    marchive >> CHNVP(collision_model);
    collision_model->SetContactable(this);
    marchive >> CHNVP(gyro);
    marchive >> CHNVP(Xforce);
    marchive >> CHNVP(Xtorque);
    // marchive << CHNVP(Force_acc); // not useful in serialization
    // marchive << CHNVP(Torque_acc);// not useful in serialization
    marchive >> CHNVP(density);
    marchive >> CHNVP(variables);
    marchive >> CHNVP(max_speed);
    marchive >> CHNVP(max_wvel);
    marchive >> CHNVP(sleep_time);
    marchive >> CHNVP(sleep_minspeed);
    marchive >> CHNVP(sleep_minwvel);
    marchive >> CHNVP(sleep_starttime);
}